

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::line_start(Fl_Text_Display *this,int pos)

{
  int iVar1;
  Fl_Text_Buffer *this_00;
  int startPos;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  
  iVar1 = this->mContinuousWrap;
  this_00 = this->mBuffer;
  startPos = Fl_Text_Buffer::line_start(this_00,pos);
  if (iVar1 != 0) {
    wrapped_line_counter
              (this,this_00,startPos,pos,0x7fffffff,true,0,&retPos,&retLines,&retLineStart,
               &retLineEnd,true);
    startPos = retLineStart;
  }
  return startPos;
}

Assistant:

int Fl_Text_Display::line_start(int pos) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* If we're not wrapping, use the more efficient BufStartOfLine */
  if (!mContinuousWrap)
    return buffer()->line_start(pos);

  wrapped_line_counter(buffer(), buffer()->line_start(pos), pos, INT_MAX, true, 0,
                       &retPos, &retLines, &retLineStart, &retLineEnd);

  IS_UTF8_ALIGNED2(buffer(), retLineStart)
  return retLineStart;
}